

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_ctype_alnum(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  int iBool;
  byte *pbVar4;
  int nLen;
  
  if (0 < nArg) {
    pbVar2 = (byte *)jx9_value_to_string(*apArg,&nLen);
    if (0 < (long)nLen) {
      pbVar4 = pbVar2 + nLen;
      do {
        if (pbVar4 <= pbVar2) {
          iBool = 1;
          goto LAB_0012dacb;
        }
        ppuVar3 = __ctype_b_loc();
        bVar1 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      } while (((*ppuVar3)[bVar1] & 8) != 0);
    }
  }
  iBool = 0;
LAB_0012dacb:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Builtin_ctype_alnum(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn  = (const unsigned char *)jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* If we reach the end of the string, then the test succeeded. */
			jx9_result_bool(pCtx, 1);
			return JX9_OK;
		}
		if( !SyisAlphaNum(zIn[0]) ){
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	/* The test failed, return FALSE */
	jx9_result_bool(pCtx, 0);
	return JX9_OK;
}